

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap.h
# Opt level: O0

int __thiscall
Glucose::Heap<Glucose::SimpSolver::ElimLt>::removeMin(Heap<Glucose::SimpSolver::ElimLt> *this)

{
  int index;
  int iVar1;
  int *piVar2;
  long in_RDI;
  int x;
  int in_stack_0000002c;
  Heap<Glucose::SimpSolver::ElimLt> *in_stack_00000030;
  
  piVar2 = vec<int>::operator[]((vec<int> *)(in_RDI + 8),0);
  index = *piVar2;
  piVar2 = vec<int>::last((vec<int> *)(in_RDI + 8));
  iVar1 = *piVar2;
  piVar2 = vec<int>::operator[]((vec<int> *)(in_RDI + 8),0);
  *piVar2 = iVar1;
  piVar2 = vec<int>::operator[]((vec<int> *)(in_RDI + 8),0);
  piVar2 = vec<int>::operator[]((vec<int> *)(in_RDI + 0x18),*piVar2);
  *piVar2 = 0;
  piVar2 = vec<int>::operator[]((vec<int> *)(in_RDI + 0x18),index);
  *piVar2 = -1;
  vec<int>::pop((vec<int> *)(in_RDI + 8));
  iVar1 = vec<int>::size((vec<int> *)(in_RDI + 8));
  if (1 < iVar1) {
    percolateDown(in_stack_00000030,in_stack_0000002c);
  }
  return index;
}

Assistant:

int  removeMin()
    {
        int x            = heap[0];
        heap[0]          = heap.last();
        indices[heap[0]] = 0;
        indices[x]       = -1;
        heap.pop();
        if (heap.size() > 1) percolateDown(0);
        return x; 
    }